

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgram::setUniformValue
          (QOpenGLShaderProgram *this,char *name,GLfloat x,GLfloat y,GLfloat z)

{
  int location;
  
  location = uniformLocation(this,name);
  setUniformValue(this,location,x,y,z);
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValue
        (const char *name, GLfloat x, GLfloat y, GLfloat z)
{
    setUniformValue(uniformLocation(name), x, y, z);
}